

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Float32_To_Int24_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  int iVar1;
  int in_ECX;
  float *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  int in_R8D;
  PaUtilTriangularDitherGenerator *in_R9;
  float fVar2;
  double dithered;
  double dither;
  PaInt32 temp;
  uchar *dest;
  float *src;
  undefined1 *local_38;
  float *local_30;
  int local_20;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  local_20 = in_R8D;
  while (local_20 != 0) {
    fVar2 = PaUtil_GenerateFloatTriangularDither(in_R9);
    iVar1 = (int)(*local_30 * 2.1474836e+09 + fVar2);
    *local_38 = (char)((uint)iVar1 >> 8);
    local_38[1] = (char)((uint)iVar1 >> 0x10);
    local_38[2] = (char)((uint)iVar1 >> 0x18);
    local_30 = local_30 + in_ECX;
    local_38 = local_38 + in_ESI * 3;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void Float32_To_Int24_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    PaInt32 temp;

    while( count-- )
    {
        /* convert to 32 bit and drop the low 8 bits */

        double dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        double dithered = ((double)*src * (2147483646.0)) + dither;
        
        temp = (PaInt32) dithered;

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = (unsigned char)(temp >> 8);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 24);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(temp >> 24);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 8);
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}